

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

int Bac_BoxFanin(Bac_Ntk_t *p,int b,int i)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  if ((-1 < b) && (iVar1 = (p->vType).nSize, b < iVar1)) {
    pcVar2 = (p->vType).pArray;
    if (((byte)pcVar2[(uint)b] >> 1) - 0x49 < 0xffffffbc) {
      __assert_fail("Bac_ObjIsBox(p, b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
    }
    uVar3 = ~i + b;
    if ((-1 < (int)uVar3) && ((int)uVar3 < iVar1)) {
      if ((pcVar2[uVar3] & 0xfcU) != 4) {
        __assert_fail("Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
      }
      if ((int)uVar3 < (p->vFanin).nSize) {
        return (p->vFanin).pArray[uVar3];
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int            Bac_BoxFanin( Bac_Ntk_t * p, int b, int i )     { return Bac_ObjFanin(p, Bac_BoxBi(p, b, i));                                                 }